

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

string * __thiscall
Connection::to_string_abi_cxx11_(string *__return_storage_ptr__,Connection *this)

{
  initializer_list<char> __l;
  bool bVar1;
  ulong uVar2;
  reference pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  _Self local_100;
  _Base_ptr local_f8;
  _Rb_tree_const_iterator<char> local_f0;
  _Self local_e8;
  char local_d9;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_d8;
  char c;
  iterator __end2;
  iterator __begin2;
  string *__range2;
  int i;
  undefined1 local_b4;
  undefined1 local_b3;
  undefined1 local_b2;
  undefined1 local_b1;
  iterator local_b0;
  size_type local_a8;
  undefined1 local_a0 [8];
  set<char,_std::less<char>,_std::allocator<char>_> escapeChars;
  string newLabel;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_19;
  Connection *local_18;
  Connection *this_local;
  string *str;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Connection *)__return_storage_ptr__;
  std::operator+(&local_40,&this->name_from,"->");
  std::operator+(__return_storage_ptr__,&local_40,&this->name_to);
  std::__cxx11::string::~string((string *)&local_40);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::string
              ((string *)&escapeChars._M_t._M_impl.super__Rb_tree_header._M_node_count);
    i._1_1_ = 0x7b;
    i._2_1_ = 0x7d;
    i._3_1_ = 0x22;
    local_b4 = 0x3b;
    local_b3 = 0x28;
    local_b2 = 0x29;
    local_b1 = 10;
    local_b0 = (iterator)((long)&i + 1);
    local_a8 = 7;
    std::allocator<char>::allocator();
    __l._M_len = local_a8;
    __l._M_array = local_b0;
    std::set<char,_std::less<char>,_std::allocator<char>_>::set
              ((set<char,_std::less<char>,_std::allocator<char>_> *)local_a0,__l,(less<char> *)&i,
               (allocator_type *)((long)&__range2 + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
    __range2._0_4_ = 0;
    __end2._M_current = (char *)std::__cxx11::string::begin();
    _Stack_d8._M_current = (char *)std::__cxx11::string::end();
    while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff28), bVar1) {
      pcVar3 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end2);
      local_d9 = *pcVar3;
      if (local_d9 != '\n') {
        if (local_d9 == '#') {
          local_d9 = '_';
        }
        __range2._0_4_ = (int)__range2 + 1;
        local_f0._M_node =
             (_Base_ptr)
             std::set<char,_std::less<char>,_std::allocator<char>_>::begin
                       ((set<char,_std::less<char>,_std::allocator<char>_> *)local_a0);
        local_f8 = (_Base_ptr)
                   std::set<char,_std::less<char>,_std::allocator<char>_>::end
                             ((set<char,_std::less<char>,_std::allocator<char>_> *)local_a0);
        local_e8._M_node =
             (_Base_ptr)
             std::find<std::_Rb_tree_const_iterator<char>,char>
                       (local_f0,(_Rb_tree_const_iterator<char>)local_f8,&local_d9);
        local_100._M_node =
             (_Base_ptr)
             std::set<char,_std::less<char>,_std::allocator<char>_>::end
                       ((set<char,_std::less<char>,_std::allocator<char>_> *)local_a0);
        bVar1 = std::operator!=(&local_e8,&local_100);
        if (bVar1) {
          std::__cxx11::string::operator+=
                    ((string *)&escapeChars._M_t._M_impl.super__Rb_tree_header._M_node_count,'\\');
        }
        std::__cxx11::string::operator+=
                  ((string *)&escapeChars._M_t._M_impl.super__Rb_tree_header._M_node_count,local_d9)
        ;
      }
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
    std::operator+(&local_140,"[label=\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &escapeChars._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::operator+(&local_120,&local_140,"\"]");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    std::set<char,_std::less<char>,_std::allocator<char>_>::~set
              ((set<char,_std::less<char>,_std::allocator<char>_> *)local_a0);
    std::__cxx11::string::~string
              ((string *)&escapeChars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  return __return_storage_ptr__;
}

Assistant:

string Connection::to_string() {
    string str = name_from + "->" + name_to;
    if (!label.empty()) {
        std::string newLabel;
        std::set<char> escapeChars = {'{', '}', '"', ';', '(', ')', '\n'};
        int i = 0;
        for (char c: label) {
            if (c == '\n')
                continue;
            if (c == '#')
                c = '_';
            i++;
            if (std::find(escapeChars.begin(), escapeChars.end(), c) != escapeChars.end()) {
                newLabel += '\\';
            }
            newLabel += c;
        }
        str += "[label=\"" + newLabel + "\"]";
    }
    return str;
}